

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestReporter.cpp
# Opt level: O1

void __thiscall
UnitTest::DeferredTestReporter::ReportFailure
          (DeferredTestReporter *this,TestDetails *details,char *failure)

{
  pointer pDVar1;
  char *__s;
  char *pcVar2;
  allocator<char> local_41;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  pDVar1 = (this->m_results).
           super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar1[-1].failed = true;
  local_40._0_4_ = details->lineNumber;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,failure,&local_41);
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<std::pair<int,std::__cxx11::string>>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)&pDVar1[-1].failures,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  __s = details->filename;
  pcVar2 = (char *)pDVar1[-1].failureFile._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&pDVar1[-1].failureFile,0,pcVar2,(ulong)__s);
  return;
}

Assistant:

void DeferredTestReporter::ReportFailure(TestDetails const& details, char const* failure)
{
    DeferredTestResult& r = m_results.back();
    r.failed = true;
    r.failures.push_back(DeferredTestResult::Failure(details.lineNumber, failure));
    r.failureFile = details.filename;
}